

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort_par.hpp
# Opt level: O1

void burst::
     radix_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::to_ordered_integral_fn,burst::low_byte_fn>
               (parallel_policy par,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               undefined8 buffer)

{
  array<unsigned_long,_2UL> shape;
  thread_pool pool;
  _Type local_50;
  thread_pool local_40;
  
  local_50 = (_Type)detail::
                    get_shape<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (par,first,last);
  if (1 < local_50[0]) {
    boost::asio::thread_pool::thread_pool(&local_40,local_50[0]);
    detail::
    radix_sort_impl<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn>
              (&local_40,local_50,first._M_current,last._M_current,buffer);
    boost::asio::thread_pool::~thread_pool(&local_40);
    return;
  }
  radix_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,burst::to_ordered_integral_fn,burst::low_byte_fn>
            (first._M_current,last._M_current,buffer);
  return;
}

Assistant:

void
        radix_sort
        (
            parallel_policy par,
            RandomAccessIterator1 first,
            RandomAccessIterator1 last,
            RandomAccessIterator2 buffer,
            Map map,
            Radix radix
        )
    {
        const auto shape = detail::get_shape(par, first, last);
        const auto thread_count = shape[0];
        if (thread_count > 1)
        {
            boost::asio::thread_pool pool(thread_count);
            detail::radix_sort_impl
            (
                pool,
                shape,
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
        else
        {
            radix_sort(first, last, buffer, map, radix);
        }
    }